

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseBreakStatement_AtFirst
          (Parser *this,StatementSyntax **stmt,StatementContext stmtCtx)

{
  bool stmtParsed;
  SyntaxKind SVar1;
  SyntaxToken *this_00;
  ostream *poVar2;
  BreakStatementSyntax *pBVar3;
  IndexType IVar4;
  BreakStatementSyntax *breakStmt;
  StatementContext stmtCtx_local;
  StatementSyntax **stmt_local;
  Parser *this_local;
  
  this_00 = peek(this,1);
  SVar1 = SyntaxToken::kind(this_00);
  if (SVar1 == Keyword_break) {
    pBVar3 = makeNode<psy::C::BreakStatementSyntax>(this);
    *stmt = &pBVar3->super_StatementSyntax;
    IVar4 = consume(this);
    pBVar3->breakKwTkIdx_ = IVar4;
    stmtParsed = match(this,SemicolonToken,&pBVar3->semicolonTkIdx_);
    this_local._7_1_ = checkStatementParse(this,stmtParsed);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x329);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,"assert failure: `break\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseBreakStatement_AtFirst(StatementSyntax*& stmt,
                                         StatementContext stmtCtx)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_break,
                     return false,
                     "assert failure: `break'");

    auto breakStmt = makeNode<BreakStatementSyntax>();
    stmt = breakStmt;
    breakStmt->breakKwTkIdx_ = consume();

    return checkStatementParse(
                match(SyntaxKind::SemicolonToken, &breakStmt->semicolonTkIdx_));
}